

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

bool __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::valueIndexForOuterAndInnerIndices
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *this,size_t outerIndex,
          size_t innerIndex,size_t *valueIndex)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  ulong local_20;
  
  piVar3 = (this->m_innerIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->m_outerStarts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar4[outerIndex];
  iVar2 = piVar4[outerIndex + 1];
  *valueIndex = (long)iVar1;
  if (iVar2 != iVar1) {
    local_20 = innerIndex;
    _Var5 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                      (piVar3 + iVar1,piVar3 + iVar2,&local_20);
    *valueIndex = (long)_Var5._M_current - (long)piVar3 >> 2;
    if (_Var5._M_current != piVar3 + iVar2) {
      return local_20 == (uint)*_Var5._M_current && -1 < *_Var5._M_current;
    }
  }
  return false;
}

Assistant:

bool SparseMatrix<ordering>::valueIndexForOuterAndInnerIndices(std::size_t outerIndex, std::size_t innerIndex, std::size_t& valueIndex) const
    {
        //We can use std::lower_bound to between rowNZIndex and rowNZIndex + rowNNZ
        //They are already sorted. The only critical point is if we have -1 in the matrix
        //Which right now it does not apply
        int outerBegin = m_outerStarts[outerIndex];
        int outerEnd = m_outerStarts[outerIndex + 1];
        std::vector<int>::const_iterator innerVectorBegin = m_innerIndices.begin();

        //initialize the return value to be the first element of the row
        valueIndex = outerBegin;
        if (outerEnd - outerBegin == 0) {
            //empty block, avoid searching
            return false;
        }

        std::vector<int>::const_iterator foundIndex = std::lower_bound(innerVectorBegin + outerBegin,
                                                                       innerVectorBegin + outerEnd, innerIndex);

        //Compute the index of the first element next or equal to the one we
        //were looking for

        valueIndex = std::distance(innerVectorBegin, foundIndex);
        if (foundIndex == innerVectorBegin + outerEnd) {
            //not found
            //return the index of the last element of the row
            //as we have to put the element as last element
            return false;
        }

        if (*foundIndex >= 0
            && static_cast<std::size_t>(*foundIndex) == innerIndex) {
            //found
            return true;
        }

        return false;
    }